

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qringbuffer.cpp
# Opt level: O0

char * __thiscall QRingBuffer::reserve(QRingBuffer *this,qint64 bytes)

{
  long lVar1;
  bool bVar2;
  qsizetype qVar3;
  QRingChunk *pQVar4;
  char *pcVar5;
  long in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  QRingChunk *chunk;
  qsizetype tail;
  qsizetype chunkSize;
  rvalue_ref in_stack_ffffffffffffff38;
  QRingChunk *in_stack_ffffffffffffff40;
  QList<QRingChunk> *in_stack_ffffffffffffff48;
  long local_80;
  long local_18;
  long local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = (long)*(int *)(in_RDI + 0x20);
  local_10 = in_RSI;
  qMax<long_long>(&local_18,&local_10);
  local_80 = 0;
  if (*(long *)(in_RDI + 0x18) == 0) {
    bVar2 = QList<QRingChunk>::isEmpty((QList<QRingChunk> *)0x62bbd2);
    if (bVar2) {
      QRingChunk::QRingChunk(in_stack_ffffffffffffff40,(qsizetype)in_stack_ffffffffffffff38);
      QList<QRingChunk>::append
                ((QList<QRingChunk> *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
      QRingChunk::~QRingChunk((QRingChunk *)0x62bc0d);
    }
    else {
      QList<QRingChunk>::first((QList<QRingChunk> *)in_stack_ffffffffffffff40);
      QRingChunk::allocate(in_stack_ffffffffffffff40,(qsizetype)in_stack_ffffffffffffff38);
    }
  }
  else {
    pQVar4 = QList<QRingChunk>::constLast(in_stack_ffffffffffffff48);
    if (((*(int *)(in_RDI + 0x20) == 0) ||
        (bVar2 = QRingChunk::isShared((QRingChunk *)0x62bc85), lVar1 = local_10, bVar2)) ||
       (qVar3 = QRingChunk::available(in_stack_ffffffffffffff40), qVar3 < lVar1)) {
      QRingChunk::QRingChunk(in_stack_ffffffffffffff40,(qsizetype)in_stack_ffffffffffffff38);
      QList<QRingChunk>::append
                ((QList<QRingChunk> *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
      QRingChunk::~QRingChunk((QRingChunk *)0x62bcdc);
    }
    else {
      local_80 = QRingChunk::size(pQVar4);
    }
  }
  pQVar4 = QList<QRingChunk>::last((QList<QRingChunk> *)in_stack_ffffffffffffff38);
  QRingChunk::grow(pQVar4,local_10);
  *(long *)(in_RDI + 0x18) = *(long *)(in_RDI + 0x18) + local_10;
  QList<QRingChunk>::last((QList<QRingChunk> *)in_stack_ffffffffffffff38);
  pcVar5 = QRingChunk::data(in_stack_ffffffffffffff40);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return pcVar5 + local_80;
}

Assistant:

char *QRingBuffer::reserve(qint64 bytes)
{
    Q_ASSERT(bytes > 0 && bytes < QByteArray::maxSize());

    const qsizetype chunkSize = qMax(qint64(basicBlockSize), bytes);
    qsizetype tail = 0;
    if (bufferSize == 0) {
        if (buffers.isEmpty())
            buffers.append(QRingChunk(chunkSize));
        else
            buffers.first().allocate(chunkSize);
    } else {
        const QRingChunk &chunk = buffers.constLast();
        // if need a new buffer
        if (basicBlockSize == 0 || chunk.isShared() || bytes > chunk.available())
            buffers.append(QRingChunk(chunkSize));
        else
            tail = chunk.size();
    }

    buffers.last().grow(bytes);
    bufferSize += bytes;
    return buffers.last().data() + tail;
}